

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O3

RgbaChannels __thiscall Imf_3_4::RgbaOutputFile::channels(RgbaOutputFile *this)

{
  RgbaChannels RVar1;
  Header *this_00;
  ChannelList *ch;
  string local_38;
  
  this_00 = OutputFile::header(this->_outputFile);
  ch = Header::channels(this_00);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"");
  RVar1 = anon_unknown_1::rgbaChannels(ch,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return RVar1;
}

Assistant:

RgbaChannels
RgbaOutputFile::channels () const
{
    return rgbaChannels (_outputFile->header ().channels ());
}